

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::ElementsAreMatcherImpl<const_std::array<unsigned_long,_5UL>_&>::
DescribeNegationTo(ElementsAreMatcherImpl<const_std::array<unsigned_long,_5UL>_&> *this,ostream *os)

{
  MatcherDescriberInterface in_RAX;
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  MatcherDescriberInterface local_38;
  
  if ((this->matchers_).
      super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->matchers_).
      super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_38._vptr_MatcherDescriberInterface = in_RAX._vptr_MatcherDescriberInterface;
    poVar1 = std::operator<<(os,"doesn\'t have ");
    Elements((ElementsAreMatcherImpl<const_std::array<unsigned_long,_5UL>_&> *)&local_38,
             ((long)(this->matchers_).
                    super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->matchers_).
                   super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    poVar1 = testing::operator<<(poVar1,(Message *)&local_38);
    std::operator<<(poVar1,", or\n");
    if (local_38._vptr_MatcherDescriberInterface != (_func_int **)0x0) {
      (**(code **)(*local_38._vptr_MatcherDescriberInterface + 8))();
    }
    lVar2 = 0;
    uVar3 = 0;
    while (uVar3 != ((long)(this->matchers_).
                           super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->matchers_).
                          super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) {
      poVar1 = std::operator<<(os,"element #");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1," ");
      MatcherBase<const_unsigned_long_&>::DescribeNegationTo
                ((MatcherBase<const_unsigned_long_&> *)
                 ((long)&(((this->matchers_).
                           super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_MatcherBase<const_unsigned_long_&>).super_MatcherDescriberInterface.
                         _vptr_MatcherDescriberInterface + lVar2),os);
      uVar3 = uVar3 + 1;
      if (uVar3 < (ulong)(((long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->matchers_).
                                super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        std::operator<<(os,", or\n");
      }
      lVar2 = lVar2 + 0x18;
    }
    return;
  }
  std::operator<<(os,"isn\'t empty");
  return;
}

Assistant:

void DescribeNegationTo(::std::ostream* os) const override {
    if (count() == 0) {
      *os << "isn't empty";
      return;
    }

    *os << "doesn't have " << Elements(count()) << ", or\n";
    for (size_t i = 0; i != count(); ++i) {
      *os << "element #" << i << " ";
      matchers_[i].DescribeNegationTo(os);
      if (i + 1 < count()) {
        *os << ", or\n";
      }
    }
  }